

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * SyMemBackendPoolAlloc(SyMemBackend *pBackend,sxu32 nByte)

{
  ulong uVar1;
  SyMemHeader *pSVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  sxu32 *psVar6;
  int iVar7;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  if (nByte < 0x7ff8) {
    uVar5 = 8;
    iVar7 = 3;
    while( true ) {
      if (nByte + 8 <= uVar5) break;
      uVar5 = uVar5 * 2;
      iVar7 = iVar7 + 1;
    }
    uVar5 = iVar7 - 3;
    pSVar2 = pBackend->apPool[uVar5];
    if (pSVar2 == (SyMemHeader *)0x0) {
      pSVar2 = (SyMemHeader *)MemBackendAlloc(pBackend,0x8000);
      if (pSVar2 == (SyMemHeader *)0x0) goto LAB_0010b0fb;
      uVar3 = (ulong)(uint)(1 << ((byte)iVar7 & 0x1f));
      pBackend->apPool[uVar5] = pSVar2;
      uVar4 = 0;
      while (uVar1 = uVar4 + uVar3, uVar1 < 0x8000) {
        *(ulong *)((long)pSVar2 + uVar4) = (long)pSVar2 + uVar4 + uVar3;
        uVar4 = uVar1;
      }
      *(undefined8 *)((long)pSVar2 + uVar4) = 0;
      pSVar2 = pBackend->apPool[uVar5];
    }
    *(SyMemHeader *)(pBackend->apPool + uVar5) = *pSVar2;
    pSVar2->nBucket = uVar5 | 0xdead0000;
  }
  else {
    pSVar2 = (SyMemHeader *)MemBackendAlloc(pBackend,nByte + 8);
    if (pSVar2 == (SyMemHeader *)0x0) {
LAB_0010b0fb:
      psVar6 = (sxu32 *)0x0;
      goto LAB_0010b120;
    }
    pSVar2->nBucket = 0xdeadffff;
  }
  psVar6 = &pSVar2->nBucket + 2;
LAB_0010b120:
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return psVar6;
}

Assistant:

JX9_PRIVATE void * SyMemBackendPoolAlloc(SyMemBackend *pBackend, sxu32 nByte)
{
	void *pChunk;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return 0;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	pChunk = MemBackendPoolAlloc(&(*pBackend), nByte);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return pChunk;
}